

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_avx2_256_32.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_diag_avx2_256_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  uint uVar28;
  __m256i vWH_00;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  long in_stack_00000008;
  int32_t k;
  int32_t *j_1;
  int32_t *i_1;
  int32_t *u;
  int32_t *t;
  int32_t *s;
  int32_t last_val;
  int32_t max_col;
  int32_t max_row;
  __m256i cond_all_col;
  __m256i cond_all_row;
  __m256i cond_last_val;
  __m256i cond_max_col;
  __m256i cond_max_row;
  __m256i cond_i;
  __m256i cond_j;
  __m256i vJltLimit;
  __m256i vJgtNegOne;
  __m256i vJeqLimit1;
  __m256i cond;
  __m256i vNWH;
  __m256i vMat;
  __m256i vIeqLimit1;
  __m256i vIltLimit;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m256i vJ;
  __m256i vF;
  __m256i vE;
  __m256i vWH;
  __m256i vNH;
  __m256i vIBoundary;
  __m256i vJLimit1;
  __m256i vJLimit;
  __m256i vILimit1;
  __m256i vILimit;
  __m256i vEndJ;
  __m256i vEndI;
  __m256i vLastVal;
  __m256i vMaxHCol;
  __m256i vMaxHRow;
  __m256i vJreset;
  __m256i vI;
  __m256i vNegOne;
  __m256i vGapN;
  __m256i vN;
  __m256i vOne;
  __m256i vGap;
  __m256i vOpen;
  __m256i vNegInf;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int32_t *F_pr;
  int32_t *H_pr;
  int32_t *s2;
  int32_t *_F_pr;
  int32_t *_H_pr;
  int32_t *s2B;
  int32_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int32_t in_stack_ffffffffffffe6c8;
  int32_t in_stack_ffffffffffffe6cc;
  undefined4 in_stack_ffffffffffffe6d8;
  int iVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  longlong lVar55;
  int *in_stack_ffffffffffffe700;
  int local_18e8;
  int local_18e4;
  int local_18d0;
  int local_18cc;
  int local_18b8;
  int local_18b4;
  int local_18a0;
  int local_189c;
  int local_1888;
  int local_1884;
  int local_1870;
  int local_186c;
  int local_1858;
  int local_1854;
  int local_1840;
  int local_183c;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  int local_17a4;
  uint local_17a0;
  int local_179c;
  int *local_1798;
  int *local_1790;
  uint *local_1788;
  uint *local_1780;
  uint *local_1778;
  uint local_176c;
  uint local_1768;
  uint local_1764;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined1 local_1540 [32];
  undefined1 local_1520 [24];
  undefined8 uStack_1508;
  undefined1 local_1500 [32];
  undefined1 local_14e0 [24];
  undefined8 uStack_14c8;
  undefined1 local_14c0 [24];
  undefined8 uStack_14a8;
  undefined1 local_14a0 [32];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 local_1340 [32];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [16];
  undefined1 auStack_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 auStack_12d0 [16];
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  uint local_11bc;
  uint local_11b8;
  uint local_11b4;
  int local_11b0;
  int local_11ac;
  uint local_11a8;
  uint local_11a4;
  parasail_result_t *local_11a0;
  int32_t *local_1198;
  int32_t *local_1190;
  int32_t *local_1188;
  int32_t *local_1180;
  int32_t *local_1178;
  int32_t *local_1170;
  int32_t *local_1168;
  int local_115c;
  int local_1158;
  uint local_1154;
  int local_1150;
  int local_114c;
  int local_1148;
  uint local_1144;
  uint local_1140;
  uint local_113c;
  long local_1138;
  long local_1128;
  parasail_result_t *local_1120;
  undefined4 local_1114;
  uint local_110c;
  undefined4 local_1108;
  uint local_1104;
  undefined4 local_1100;
  undefined4 local_10fc;
  undefined4 local_10f8;
  uint local_10ec;
  uint local_10e8;
  uint local_10e4;
  undefined1 local_10e0 [16];
  undefined1 auStack_10d0 [16];
  uint local_10c0;
  uint local_10bc;
  uint local_10b8;
  uint local_10b4;
  uint local_10b0;
  uint local_10ac;
  uint local_10a8;
  uint local_10a4;
  undefined1 local_10a0 [16];
  undefined1 auStack_1090 [16];
  uint local_1080;
  uint local_107c;
  uint local_1078;
  uint local_1074;
  uint local_1070;
  uint local_106c;
  uint local_1068;
  uint local_1064;
  undefined1 local_1060 [16];
  undefined1 auStack_1050 [16];
  uint local_1040;
  uint local_103c;
  uint local_1038;
  uint local_1034;
  uint local_1030;
  uint local_102c;
  uint local_1028;
  uint local_1024;
  undefined1 local_1020 [16];
  undefined1 auStack_1010 [16];
  undefined1 local_fe0 [16];
  undefined1 auStack_fd0 [16];
  undefined1 local_fa0 [16];
  undefined1 auStack_f90 [16];
  undefined4 local_f80;
  undefined4 local_f7c;
  undefined4 local_f78;
  undefined4 local_f74;
  undefined4 local_f70;
  undefined4 local_f6c;
  undefined4 local_f68;
  undefined4 local_f64;
  undefined1 local_f60 [32];
  undefined4 local_f40;
  undefined4 local_f3c;
  undefined4 local_f38;
  undefined4 local_f34;
  undefined4 local_f30;
  undefined4 local_f2c;
  undefined4 local_f28;
  undefined4 local_f24;
  undefined1 local_f20 [32];
  undefined4 local_f00;
  undefined4 local_efc;
  undefined4 local_ef8;
  undefined4 local_ef4;
  undefined4 local_ef0;
  undefined4 local_eec;
  undefined4 local_ee8;
  undefined4 local_ee4;
  undefined1 local_ee0 [32];
  uint local_ec0;
  uint local_ebc;
  uint local_eb8;
  uint local_eb4;
  uint local_eb0;
  uint local_eac;
  uint local_ea8;
  uint local_ea4;
  undefined1 local_ea0 [16];
  undefined1 auStack_e90 [16];
  undefined4 local_e80;
  undefined4 local_e7c;
  undefined4 local_e78;
  undefined4 local_e74;
  undefined4 local_e70;
  undefined4 local_e6c;
  undefined4 local_e68;
  undefined4 local_e64;
  undefined1 local_e60 [16];
  undefined1 auStack_e50 [16];
  uint local_e40;
  uint local_e3c;
  uint local_e38;
  uint local_e34;
  uint local_e30;
  uint local_e2c;
  uint local_e28;
  uint local_e24;
  undefined1 local_e20 [32];
  undefined1 local_de0 [32];
  undefined4 local_dc0;
  undefined4 local_dbc;
  undefined4 local_db8;
  undefined4 local_db4;
  undefined4 local_db0;
  undefined4 local_dac;
  undefined4 local_da8;
  undefined4 local_da4;
  undefined1 local_da0 [16];
  undefined1 auStack_d90 [16];
  uint local_d80;
  undefined4 local_d7c;
  undefined4 local_d78;
  undefined4 local_d74;
  uint local_d70;
  undefined4 local_d6c;
  undefined4 local_d68;
  undefined4 local_d64;
  undefined1 local_d60 [32];
  uint local_d40;
  int local_d3c;
  int local_d38;
  int local_d34;
  uint local_d30;
  int local_d2c;
  int local_d28;
  int local_d24;
  undefined1 local_d20 [16];
  undefined1 auStack_d10 [16];
  undefined4 local_d00;
  undefined4 local_cfc;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined4 local_cf0;
  undefined4 local_cec;
  undefined4 local_ce8;
  undefined4 local_ce4;
  undefined1 local_ce0 [16];
  undefined1 auStack_cd0 [16];
  undefined4 local_cc0;
  undefined4 local_cbc;
  undefined4 local_cb8;
  undefined4 local_cb4;
  undefined4 local_cb0;
  undefined4 local_cac;
  undefined4 local_ca8;
  undefined4 local_ca4;
  undefined1 local_ca0 [16];
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [16];
  undefined1 auStack_b30 [16];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [16];
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [16];
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined1 local_60 [32];
  
  local_1148 = 0;
  local_114c = 0;
  local_1150 = 0;
  local_1154 = 0;
  local_1158 = 0;
  local_115c = 0;
  local_1168 = (int32_t *)0x0;
  local_1170 = (int32_t *)0x0;
  local_1178 = (int32_t *)0x0;
  local_1180 = (int32_t *)0x0;
  local_1188 = (int32_t *)0x0;
  local_1190 = (int32_t *)0x0;
  local_1198 = (int32_t *)0x0;
  local_11a0 = (parasail_result_t *)0x0;
  local_11a4 = 0;
  local_11a8 = 0;
  local_11ac = 0;
  local_11b0 = 0;
  local_11b4 = 0;
  local_11b8 = 0;
  local_11bc = 0;
  if (in_RDX == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_avx2_256_32","_s2");
    local_1120 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_diag_avx2_256_32","s2Len");
    local_1120 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_diag_avx2_256_32","open");
    local_1120 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R9D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_diag_avx2_256_32","gap");
    local_1120 = (parasail_result_t *)0x0;
  }
  else if (in_stack_00000008 == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_avx2_256_32","matrix");
    local_1120 = (parasail_result_t *)0x0;
  }
  else {
    if (*(int *)(in_stack_00000008 + 0x30) == 0) {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_avx2_256_32","_s1");
        return (parasail_result_t *)0x0;
      }
      if ((int)in_ESI < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_diag_avx2_256_32","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_1148 = 8;
    local_114c = 7;
    local_1150 = 0xe;
    local_17a0 = in_ESI;
    if (*(int *)(in_stack_00000008 + 0x30) != 0) {
      local_17a0 = *(uint *)(in_stack_00000008 + 0x34);
    }
    local_1154 = local_17a0;
    local_1158 = local_17a0 + 7;
    local_115c = in_ECX + 7;
    local_11a4 = 0;
    local_11a8 = 0;
    local_11ac = 0;
    local_11b0 = 0;
    if ((int)-in_R8D < *(int *)(in_stack_00000008 + 0x20)) {
      local_17a4 = in_R8D + 0x80000000;
    }
    else {
      local_17a4 = -0x80000000 - *(int *)(in_stack_00000008 + 0x20);
    }
    local_11bc = local_17a4 + 1;
    local_11b8 = 0x7ffffffe - *(int *)(in_stack_00000008 + 0x1c);
    auVar17 = vpinsrd_avx(ZEXT416(local_11bc),local_11bc,1);
    auVar17 = vpinsrd_avx(auVar17,local_11bc,2);
    local_10e0 = vpinsrd_avx(auVar17,local_11bc,3);
    auVar17 = vpinsrd_avx(ZEXT416(local_11bc),local_11bc,1);
    auVar17 = vpinsrd_avx(auVar17,local_11bc,2);
    auStack_10d0 = vpinsrd_avx(auVar17,local_11bc,3);
    local_11e0 = local_10e0._0_8_;
    uStack_11d8 = local_10e0._8_8_;
    uStack_11d0 = auStack_10d0._0_8_;
    uStack_11c8 = auStack_10d0._8_8_;
    auVar17 = vpinsrd_avx(ZEXT416(local_11b8),local_11b8,1);
    auVar17 = vpinsrd_avx(auVar17,local_11b8,2);
    local_10a0 = vpinsrd_avx(auVar17,local_11b8,3);
    auVar17 = vpinsrd_avx(ZEXT416(local_11b8),local_11b8,1);
    auVar17 = vpinsrd_avx(auVar17,local_11b8,2);
    auStack_1090 = vpinsrd_avx(auVar17,local_11b8,3);
    local_1200 = local_10a0._0_8_;
    uStack_11f8 = local_10a0._8_8_;
    uStack_11f0 = auStack_1090._0_8_;
    uStack_11e8 = auStack_1090._8_8_;
    local_1220._16_8_ = auStack_1090._0_8_;
    local_1220._0_16_ = local_10a0;
    local_1220._24_8_ = auStack_1090._8_8_;
    local_1240._16_8_ = auStack_10d0._0_8_;
    local_1240._0_16_ = local_10e0;
    local_1240._24_8_ = auStack_10d0._8_8_;
    auVar17 = vpinsrd_avx(ZEXT416(local_11bc),local_11bc,1);
    auVar17 = vpinsrd_avx(auVar17,local_11bc,2);
    local_1060 = vpinsrd_avx(auVar17,local_11bc,3);
    auVar17 = vpinsrd_avx(ZEXT416(local_11bc),local_11bc,1);
    auVar17 = vpinsrd_avx(auVar17,local_11bc,2);
    auStack_1050 = vpinsrd_avx(auVar17,local_11bc,3);
    local_1260 = local_1060._0_8_;
    uStack_1258 = local_1060._8_8_;
    uStack_1250 = auStack_1050._0_8_;
    uStack_1248 = auStack_1050._8_8_;
    auVar17 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar17 = vpinsrd_avx(auVar17,in_R8D,2);
    local_1020 = vpinsrd_avx(auVar17,in_R8D,3);
    auVar17 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar17 = vpinsrd_avx(auVar17,in_R8D,2);
    auStack_1010 = vpinsrd_avx(auVar17,in_R8D,3);
    local_1280 = local_1020._0_8_;
    uStack_1278 = local_1020._8_8_;
    uStack_1270 = auStack_1010._0_8_;
    uStack_1268 = auStack_1010._8_8_;
    auVar17 = vpinsrd_avx(ZEXT416(in_R9D),in_R9D,1);
    auVar17 = vpinsrd_avx(auVar17,in_R9D,2);
    local_fe0 = vpinsrd_avx(auVar17,in_R9D,3);
    auVar17 = vpinsrd_avx(ZEXT416(in_R9D),in_R9D,1);
    auVar17 = vpinsrd_avx(auVar17,in_R9D,2);
    auStack_fd0 = vpinsrd_avx(auVar17,in_R9D,3);
    local_12a0 = local_fe0._0_8_;
    uStack_1298 = local_fe0._8_8_;
    uStack_1290 = auStack_fd0._0_8_;
    uStack_1288 = auStack_fd0._8_8_;
    local_10f8 = 1;
    local_f64 = 1;
    local_f68 = 1;
    local_f6c = 1;
    local_f70 = 1;
    local_f74 = 1;
    local_f78 = 1;
    local_f7c = 1;
    local_f80 = 1;
    auVar17 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar17 = vpinsrd_avx(auVar17,1,2);
    local_fa0 = vpinsrd_avx(auVar17,1,3);
    auVar17 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar17 = vpinsrd_avx(auVar17,1,2);
    auStack_f90 = vpinsrd_avx(auVar17,1,3);
    local_12c0 = local_fa0._0_8_;
    uStack_12b8 = local_fa0._8_8_;
    uStack_12b0 = auStack_f90._0_8_;
    uStack_12a8 = auStack_f90._8_8_;
    local_10fc = 8;
    local_f24 = 8;
    local_f28 = 8;
    local_f2c = 8;
    local_f30 = 8;
    local_f34 = 8;
    local_f38 = 8;
    local_f3c = 8;
    local_f40 = 8;
    auVar17 = vpinsrd_avx(ZEXT416(8),8,1);
    auVar17 = vpinsrd_avx(auVar17,8,2);
    auVar17 = vpinsrd_avx(auVar17,8,3);
    auVar18 = vpinsrd_avx(ZEXT416(8),8,1);
    auVar18 = vpinsrd_avx(auVar18,8,2);
    auVar18 = vpinsrd_avx(auVar18,8,3);
    local_f60._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar18;
    local_f60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar17;
    if ((int)matrix == 0) {
      local_1104 = in_R9D * 8;
      auVar17 = vpinsrd_avx(ZEXT416(local_1104),local_1104,1);
      auVar17 = vpinsrd_avx(auVar17,local_1104,2);
      auVar17 = vpinsrd_avx(auVar17,local_1104,3);
      auVar18 = vpinsrd_avx(ZEXT416(local_1104),local_1104,1);
      auVar18 = vpinsrd_avx(auVar18,local_1104,2);
      auVar18 = vpinsrd_avx(auVar18,local_1104,3);
      local_ee0._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar18;
      local_ee0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar17;
      local_ec0 = local_1104;
      local_ebc = local_1104;
      local_eb8 = local_1104;
      local_eb4 = local_1104;
      local_eb0 = local_1104;
      local_eac = local_1104;
      local_ea8 = local_1104;
      local_ea4 = local_1104;
      local_1300 = local_ee0._0_16_;
      auStack_12f0 = local_ee0._16_16_;
    }
    else {
      local_1100 = 0;
      local_ee4 = 0;
      local_ee8 = 0;
      local_eec = 0;
      local_ef0 = 0;
      local_ef4 = 0;
      local_ef8 = 0;
      local_efc = 0;
      local_f00 = 0;
      auVar17 = vpinsrd_avx(ZEXT416(0),0,1);
      auVar17 = vpinsrd_avx(auVar17,0,2);
      auVar17 = vpinsrd_avx(auVar17,0,3);
      auVar18 = vpinsrd_avx(ZEXT416(0),0,1);
      auVar18 = vpinsrd_avx(auVar18,0,2);
      auVar18 = vpinsrd_avx(auVar18,0,3);
      local_f20._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar18;
      local_f20._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar17;
      local_1300 = local_f20._0_16_;
      auStack_12f0 = local_f20._16_16_;
    }
    local_1108 = 0xffffffff;
    local_e64 = 0xffffffff;
    local_e68 = 0xffffffff;
    local_e6c = 0xffffffff;
    local_e70 = 0xffffffff;
    local_e74 = 0xffffffff;
    local_e78 = 0xffffffff;
    local_e7c = 0xffffffff;
    local_e80 = 0xffffffff;
    auVar17 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
    auVar17 = vpinsrd_avx(auVar17,0xffffffff,2);
    local_ea0 = vpinsrd_avx(auVar17,0xffffffff,3);
    auVar17 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
    auVar17 = vpinsrd_avx(auVar17,0xffffffff,2);
    auStack_e90 = vpinsrd_avx(auVar17,0xffffffff,3);
    local_1320 = local_ea0._0_8_;
    uStack_1318 = local_ea0._8_8_;
    uStack_1310 = auStack_e90._0_8_;
    uStack_1308 = auStack_e90._8_8_;
    local_ca4 = 0;
    local_ca8 = 1;
    local_cac = 2;
    local_cb0 = 3;
    local_cb4 = 4;
    local_cb8 = 5;
    local_cbc = 6;
    local_cc0 = 7;
    auVar17 = vpinsrd_avx(ZEXT416(7),6,1);
    auVar17 = vpinsrd_avx(auVar17,5,2);
    local_ce0 = vpinsrd_avx(auVar17,4,3);
    auVar17 = vpinsrd_avx(ZEXT416(3),2,1);
    auVar17 = vpinsrd_avx(auVar17,1,2);
    auStack_cd0 = vpinsrd_avx(auVar17,0,3);
    local_1340._16_8_ = auStack_cd0._0_8_;
    local_1340._0_16_ = local_ce0;
    local_1340._24_8_ = auStack_cd0._8_8_;
    local_ce4 = 0;
    local_ce8 = 0xffffffff;
    local_cec = 0xfffffffe;
    local_cf0 = 0xfffffffd;
    local_cf4 = 0xfffffffc;
    local_cf8 = 0xfffffffb;
    local_cfc = 0xfffffffa;
    local_d00 = 0xfffffff9;
    auVar17 = vpinsrd_avx(ZEXT416(0xfffffff9),0xfffffffa,1);
    auVar17 = vpinsrd_avx(auVar17,0xfffffffb,2);
    local_d20 = vpinsrd_avx(auVar17,0xfffffffc,3);
    auVar17 = vpinsrd_avx(ZEXT416(0xfffffffd),0xfffffffe,1);
    auVar17 = vpinsrd_avx(auVar17,0xffffffff,2);
    auStack_d10 = vpinsrd_avx(auVar17,0,3);
    local_1360 = local_d20._0_8_;
    uStack_1358 = local_d20._8_8_;
    uStack_1350 = auStack_d10._0_8_;
    uStack_1348 = auStack_d10._8_8_;
    local_1380._16_8_ = auStack_1050._0_8_;
    local_1380._0_16_ = local_1060;
    local_1380._24_8_ = auStack_1050._8_8_;
    local_13a0._16_8_ = auStack_1050._0_8_;
    local_13a0._0_16_ = local_1060;
    local_13a0._24_8_ = auStack_1050._8_8_;
    local_13c0._16_8_ = auStack_1050._0_8_;
    local_13c0._0_16_ = local_1060;
    local_13c0._24_8_ = auStack_1050._8_8_;
    local_13e0._16_8_ = auStack_1050._0_8_;
    local_13e0._0_16_ = local_1060;
    local_13e0._24_8_ = auStack_1050._8_8_;
    local_1400._16_8_ = auStack_1050._0_8_;
    local_1400._0_16_ = local_1060;
    local_1400._24_8_ = auStack_1050._8_8_;
    local_110c = local_17a0;
    local_e24 = local_17a0;
    local_e28 = local_17a0;
    local_e2c = local_17a0;
    local_e30 = local_17a0;
    local_e34 = local_17a0;
    local_e38 = local_17a0;
    local_e3c = local_17a0;
    local_e40 = local_17a0;
    auVar17 = vpinsrd_avx(ZEXT416(local_17a0),local_17a0,1);
    auVar17 = vpinsrd_avx(auVar17,local_17a0,2);
    auVar17 = vpinsrd_avx(auVar17,local_17a0,3);
    auVar18 = vpinsrd_avx(ZEXT416(local_17a0),local_17a0,1);
    auVar18 = vpinsrd_avx(auVar18,local_17a0,2);
    auStack_e50 = vpinsrd_avx(auVar18,local_17a0,3);
    local_e60._0_8_ = auVar17._0_8_;
    uVar44 = local_e60._0_8_;
    local_e60._8_8_ = auVar17._8_8_;
    uVar45 = local_e60._8_8_;
    uVar46 = auStack_e50._0_8_;
    uVar47 = auStack_e50._8_8_;
    local_b00 = local_e60._0_8_;
    uStack_af8 = local_e60._8_8_;
    uStack_af0 = auStack_e50._0_8_;
    uStack_ae8 = auStack_e50._8_8_;
    local_b20 = local_fa0._0_8_;
    uStack_b18 = local_fa0._8_8_;
    uStack_b10 = auStack_f90._0_8_;
    uStack_b08 = auStack_f90._8_8_;
    auVar21._16_8_ = auStack_e50._0_8_;
    auVar21._0_16_ = auVar17;
    auVar21._24_8_ = auStack_e50._8_8_;
    auVar26._16_8_ = auStack_f90._0_8_;
    auVar26._0_16_ = local_fa0;
    auVar26._24_8_ = auStack_f90._8_8_;
    auVar26 = vpsubd_avx2(auVar21,auVar26);
    auVar18 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar18 = vpinsrd_avx(auVar18,in_ECX,2);
    auVar18 = vpinsrd_avx(auVar18,in_ECX,3);
    auVar19 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar19 = vpinsrd_avx(auVar19,in_ECX,2);
    auVar19 = vpinsrd_avx(auVar19,in_ECX,3);
    auVar50._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
    auVar50._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
    local_e20._16_8_ = auVar50._16_8_;
    uVar48 = local_e20._16_8_;
    local_e20._24_8_ = auVar50._24_8_;
    uVar49 = local_e20._24_8_;
    local_b60 = local_fa0._0_8_;
    uStack_b58 = local_fa0._8_8_;
    uStack_b50 = auStack_f90._0_8_;
    uStack_b48 = auStack_f90._8_8_;
    auVar20._16_8_ = local_e20._16_8_;
    auVar20._0_16_ = auVar50._0_16_;
    auVar20._24_8_ = local_e20._24_8_;
    auVar27._16_8_ = auStack_f90._0_8_;
    auVar27._0_16_ = local_fa0;
    auVar27._24_8_ = auStack_f90._8_8_;
    auVar27 = vpsubd_avx2(auVar20,auVar27);
    if ((int)matrix == 0) {
      local_d24 = -in_R8D;
      local_d28 = local_d24 - in_R9D;
      local_d2c = local_d24 + in_R9D * -2;
      local_d30 = local_d24 + in_R9D * -3;
      local_d34 = local_d24 + in_R9D * -4;
      local_d38 = local_d24 + in_R9D * -5;
      local_d3c = local_d24 + in_R9D * -6;
      local_d40 = in_R9D * -7 - in_R8D;
      auVar18 = vpinsrd_avx(ZEXT416(local_d30),local_d2c,1);
      auVar18 = vpinsrd_avx(auVar18,local_d28,2);
      auVar18 = vpinsrd_avx(auVar18,local_d24,3);
      auVar19 = vpinsrd_avx(ZEXT416(local_d40),local_d3c,1);
      auVar19 = vpinsrd_avx(auVar19,local_d38,2);
      auVar19 = vpinsrd_avx(auVar19,local_d34,3);
      local_d60._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
      local_d60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
      local_14a0._0_16_ = local_d60._0_16_;
      auVar18 = local_d60._16_16_;
    }
    else {
      local_1114 = 0;
      local_da4 = 0;
      local_da8 = 0;
      local_dac = 0;
      local_db0 = 0;
      local_db4 = 0;
      local_db8 = 0;
      local_dbc = 0;
      local_dc0 = 0;
      auVar18 = vpinsrd_avx(ZEXT416(0),0,1);
      auVar18 = vpinsrd_avx(auVar18,0,2);
      auVar18 = vpinsrd_avx(auVar18,0,3);
      auVar19 = vpinsrd_avx(ZEXT416(0),0,1);
      auVar19 = vpinsrd_avx(auVar19,0,2);
      auVar19 = vpinsrd_avx(auVar19,0,3);
      local_de0._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
      local_de0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
      local_14a0._0_16_ = local_de0._0_16_;
      auVar18 = local_de0._16_16_;
    }
    uStack_1808 = auVar18._8_8_;
    uStack_1810 = auVar18._0_8_;
    local_14a0._16_8_ = uStack_1810;
    local_14a0._24_8_ = uStack_1808;
    local_11b4 = local_11bc;
    local_1144 = in_R9D;
    local_1140 = in_R8D;
    local_113c = in_ECX;
    local_1138 = in_RDX;
    local_1128 = in_RDI;
    local_10ec = local_11bc;
    local_10e8 = local_11b8;
    local_10e4 = local_11bc;
    local_10c0 = local_11bc;
    local_10bc = local_11bc;
    local_10b8 = local_11bc;
    local_10b4 = local_11bc;
    local_10b0 = local_11bc;
    local_10ac = local_11bc;
    local_10a8 = local_11bc;
    local_10a4 = local_11bc;
    local_1080 = local_11b8;
    local_107c = local_11b8;
    local_1078 = local_11b8;
    local_1074 = local_11b8;
    local_1070 = local_11b8;
    local_106c = local_11b8;
    local_1068 = local_11b8;
    local_1064 = local_11b8;
    local_1040 = local_11bc;
    local_103c = local_11bc;
    local_1038 = local_11bc;
    local_1034 = local_11bc;
    local_1030 = local_11bc;
    local_102c = local_11bc;
    local_1028 = local_11bc;
    local_1024 = local_11bc;
    local_e60 = auVar17;
    local_e20 = auVar50;
    local_12e0 = local_f60._0_16_;
    auStack_12d0 = local_f60._16_16_;
    local_b40 = auVar50._0_16_;
    auStack_b30 = auVar50._16_16_;
    local_11a0 = parasail_result_new_table1(local_17a0,in_ECX);
    if (local_11a0 == (parasail_result_t *)0x0) {
      local_1120 = (parasail_result_t *)0x0;
    }
    else {
      local_11a0->flag = local_11a0->flag | 0x8401002;
      uVar28 = 0;
      if ((int)matrix != 0) {
        uVar28 = 8;
      }
      local_11a0->flag = uVar28 | local_11a0->flag;
      uVar28 = 0;
      if (s1_beg != 0) {
        uVar28 = 0x10;
      }
      local_11a0->flag = uVar28 | local_11a0->flag;
      uVar28 = 0;
      if (s1_end != 0) {
        uVar28 = 0x4000;
      }
      local_11a0->flag = uVar28 | local_11a0->flag;
      uVar28 = 0;
      if (s2_beg != 0) {
        uVar28 = 0x8000;
      }
      local_11a0->flag = uVar28 | local_11a0->flag;
      local_11a0->flag = local_11a0->flag | 0x20000;
      local_1170 = parasail_memalign_int32_t(0x20,(long)(int)(local_113c + local_1150));
      local_1178 = parasail_memalign_int32_t(0x20,(long)(int)(local_113c + local_1150));
      local_1180 = parasail_memalign_int32_t(0x20,(long)(int)(local_113c + local_1150));
      local_1188 = local_1170 + local_114c;
      local_1190 = local_1178 + local_114c;
      local_1198 = local_1180 + local_114c;
      if (local_1170 == (int32_t *)0x0) {
        local_1120 = (parasail_result_t *)0x0;
      }
      else if (local_1178 == (int32_t *)0x0) {
        local_1120 = (parasail_result_t *)0x0;
      }
      else if (local_1180 == (int32_t *)0x0) {
        local_1120 = (parasail_result_t *)0x0;
      }
      else {
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          local_1168 = parasail_memalign_int32_t(0x20,(long)(int)(local_1154 + local_114c));
          if (local_1168 == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (local_11a4 = 0; (int)local_11a4 < (int)local_1154; local_11a4 = local_11a4 + 1) {
            local_1168[(int)local_11a4] =
                 *(int32_t *)
                  (*(long *)(in_stack_00000008 + 0x10) +
                  (ulong)*(byte *)(local_1128 + (int)local_11a4) * 4);
          }
          for (local_11a4 = local_1154; (int)local_11a4 < local_1158; local_11a4 = local_11a4 + 1) {
            local_1168[(int)local_11a4] = 0;
          }
        }
        for (local_11a8 = 0; (int)local_11a8 < (int)local_113c; local_11a8 = local_11a8 + 1) {
          local_1188[(int)local_11a8] =
               *(int32_t *)
                (*(long *)(in_stack_00000008 + 0x10) +
                (ulong)*(byte *)(local_1138 + (int)local_11a8) * 4);
        }
        for (local_11a8 = -local_114c; (int)local_11a8 < 0; local_11a8 = local_11a8 + 1) {
          local_1188[(int)local_11a8] = 0;
        }
        for (local_11a8 = local_113c; (int)local_11a8 < local_115c; local_11a8 = local_11a8 + 1) {
          local_1188[(int)local_11a8] = 0;
        }
        if (s1_end == 0) {
          for (local_11a8 = 0; (int)local_11a8 < (int)local_113c; local_11a8 = local_11a8 + 1) {
            local_1190[(int)local_11a8] = -(local_11a8 * local_1144) - local_1140;
            local_1198[(int)local_11a8] = local_11b4;
          }
        }
        else {
          for (local_11a8 = 0; (int)local_11a8 < (int)local_113c; local_11a8 = local_11a8 + 1) {
            local_1190[(int)local_11a8] = 0;
            local_1198[(int)local_11a8] = local_11b4;
          }
        }
        for (local_11a8 = -local_114c; (int)local_11a8 < 0; local_11a8 = local_11a8 + 1) {
          local_1190[(int)local_11a8] = local_11b4;
          local_1198[(int)local_11a8] = local_11b4;
        }
        for (local_11a8 = local_113c; (int)local_11a8 < (int)(local_113c + local_114c);
            local_11a8 = local_11a8 + 1) {
          local_1190[(int)local_11a8] = local_11b4;
          local_1198[(int)local_11a8] = local_11b4;
        }
        local_1190[-1] = 0;
        for (local_11a4 = 0; (int)local_11a4 < (int)local_1154; local_11a4 = local_1148 + local_11a4
            ) {
          local_14c0._8_8_ = uStack_1258;
          local_14c0._0_8_ = local_1260;
          local_14c0._16_8_ = uStack_1250;
          uStack_14a8 = uStack_1248;
          local_14e0._8_8_ = uStack_1258;
          local_14e0._0_8_ = local_1260;
          local_14e0._16_8_ = uStack_1250;
          uStack_14c8 = uStack_1248;
          local_1500._8_8_ = uStack_1258;
          local_1500._0_8_ = local_1260;
          local_1500._16_8_ = uStack_1250;
          local_1500._24_8_ = uStack_1248;
          local_1520._8_8_ = uStack_1258;
          local_1520._0_8_ = local_1260;
          local_1520._16_8_ = uStack_1250;
          uStack_1508 = uStack_1248;
          local_1540._8_8_ = uStack_1358;
          local_1540._0_8_ = local_1360;
          local_1540._16_8_ = uStack_1350;
          local_1540._24_8_ = uStack_1348;
          lVar9 = *(long *)(in_stack_00000008 + 8);
          iVar1 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_183c = local_1168[(int)local_11a4];
          }
          else {
            if ((int)local_11a4 < (int)local_1154) {
              local_1840 = local_11a4;
            }
            else {
              local_1840 = local_1154 - 1;
            }
            local_183c = local_1840;
          }
          lVar10 = *(long *)(in_stack_00000008 + 8);
          iVar2 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1854 = local_1168[(int)(local_11a4 + 1)];
          }
          else {
            if ((int)(local_11a4 + 1) < (int)local_1154) {
              local_1858 = local_11a4 + 1;
            }
            else {
              local_1858 = local_1154 - 1;
            }
            local_1854 = local_1858;
          }
          lVar11 = *(long *)(in_stack_00000008 + 8);
          iVar3 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_186c = local_1168[(int)(local_11a4 + 2)];
          }
          else {
            if ((int)(local_11a4 + 2) < (int)local_1154) {
              local_1870 = local_11a4 + 2;
            }
            else {
              local_1870 = local_1154 - 1;
            }
            local_186c = local_1870;
          }
          lVar12 = *(long *)(in_stack_00000008 + 8);
          iVar4 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1884 = local_1168[(int)(local_11a4 + 3)];
          }
          else {
            if ((int)(local_11a4 + 3) < (int)local_1154) {
              local_1888 = local_11a4 + 3;
            }
            else {
              local_1888 = local_1154 - 1;
            }
            local_1884 = local_1888;
          }
          lVar13 = *(long *)(in_stack_00000008 + 8);
          iVar5 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_189c = local_1168[(int)(local_11a4 + 4)];
          }
          else {
            if ((int)(local_11a4 + 4) < (int)local_1154) {
              local_18a0 = local_11a4 + 4;
            }
            else {
              local_18a0 = local_1154 - 1;
            }
            local_189c = local_18a0;
          }
          lVar14 = *(long *)(in_stack_00000008 + 8);
          iVar6 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_18b4 = local_1168[(int)(local_11a4 + 5)];
          }
          else {
            if ((int)(local_11a4 + 5) < (int)local_1154) {
              local_18b8 = local_11a4 + 5;
            }
            else {
              local_18b8 = local_1154 - 1;
            }
            local_18b4 = local_18b8;
          }
          lVar15 = *(long *)(in_stack_00000008 + 8);
          iVar7 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_18cc = local_1168[(int)(local_11a4 + 6)];
          }
          else {
            if ((int)(local_11a4 + 6) < (int)local_1154) {
              local_18d0 = local_11a4 + 6;
            }
            else {
              local_18d0 = local_1154 - 1;
            }
            local_18cc = local_18d0;
          }
          lVar16 = *(long *)(in_stack_00000008 + 8);
          iVar8 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_18e4 = local_1168[(int)(local_11a4 + 7)];
          }
          else {
            if ((int)(local_11a4 + 7) < (int)local_1154) {
              local_18e8 = local_11a4 + 7;
            }
            else {
              local_18e8 = local_1154 - 1;
            }
            local_18e4 = local_18e8;
          }
          local_940 = uVar44;
          uStack_938 = uVar45;
          uStack_930 = uVar46;
          uStack_928 = uVar47;
          local_960 = local_1340._0_8_;
          uStack_958 = local_1340._8_8_;
          uStack_950 = local_1340._16_8_;
          uStack_948 = local_1340._24_8_;
          auVar24._16_8_ = uVar46;
          auVar24._0_16_ = auVar17;
          auVar24._24_8_ = uVar47;
          auVar21 = vpcmpgtd_avx2(auVar24,local_1340);
          local_1440 = auVar26._0_8_;
          uStack_1438 = auVar26._8_8_;
          uStack_1430 = auVar26._16_8_;
          uStack_1428 = auVar26._24_8_;
          local_880 = local_1340._0_8_;
          uStack_878 = local_1340._8_8_;
          uStack_870 = local_1340._16_8_;
          uStack_868 = local_1340._24_8_;
          local_8a0 = local_1440;
          uStack_898 = uStack_1438;
          uStack_890 = uStack_1430;
          uStack_888 = uStack_1428;
          auVar20 = vpcmpeqd_avx2(local_1340,auVar26);
          local_740 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffeb50),0xc);
          local_760 = vpsrldq_avx2(_local_14c0,4);
          auVar24 = vpor_avx2(local_740,local_760);
          _local_14c0 = auVar24._0_28_;
          uStack_14a8._4_4_ = local_1190[-1];
          local_780 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffeb30),0xc);
          local_7a0 = vpsrldq_avx2(_local_14e0,4);
          auVar24 = vpor_avx2(local_780,local_7a0);
          local_14e0._0_8_ = auVar24._0_8_;
          local_14e0._8_8_ = auVar24._8_8_;
          local_14e0._16_8_ = auVar24._16_8_;
          if ((int)matrix == 0) {
            iVar52 = -(local_11a4 * local_1144) - local_1140;
          }
          else {
            iVar52 = 0;
          }
          auVar51._4_4_ = iVar52;
          auVar51._0_4_ = iVar52;
          auVar51._8_4_ = iVar52;
          auVar51._12_4_ = iVar52;
          auVar51._16_4_ = iVar52;
          auVar51._20_4_ = iVar52;
          auVar51._24_4_ = iVar52;
          auVar51._28_4_ = iVar52;
          auVar24 = vpblendd_avx2(auVar24,auVar51,0x80);
          local_1190[-1] = -((local_11a4 + local_1148) * local_1144) - local_1140;
          local_11a8 = 0;
          uVar53 = local_14e0._0_8_;
          uVar54 = local_14e0._8_8_;
          lVar55 = local_14e0._16_8_;
          _local_14e0 = auVar24;
          while( true ) {
            auVar24 = _local_14c0;
            if ((int)(local_113c + local_114c) <= (int)local_11a8) break;
            local_540 = local_14c0._0_8_;
            uStack_528 = uStack_14a8;
            local_7c0 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffeb30),0xc);
            local_7e0 = vpsrldq_avx2(_local_14e0,4);
            auVar51 = vpor_avx2(local_7c0,local_7e0);
            _local_14c0 = auVar51._0_28_;
            uStack_14a8._4_4_ = local_1190[(int)local_11a8];
            auVar34 = _local_14c0;
            local_800 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffeaf0),0xc);
            local_820 = vpsrldq_avx2(_local_1520,4);
            auVar25 = vpor_avx2(local_800,local_820);
            _local_1520 = auVar25._0_28_;
            uStack_1508._4_4_ = local_1198[(int)local_11a8];
            auVar23 = _local_1520;
            local_14c0._0_8_ = auVar51._0_8_;
            local_14c0._8_8_ = auVar51._8_8_;
            local_14c0._16_8_ = auVar51._16_8_;
            uStack_14a8 = auVar34._24_8_;
            local_b80 = local_14c0._0_8_;
            uStack_b78 = local_14c0._8_8_;
            uStack_b70 = local_14c0._16_8_;
            uStack_b68 = uStack_14a8;
            local_ba0 = local_1280;
            uStack_b98 = uStack_1278;
            uStack_b90 = uStack_1270;
            uStack_b88 = uStack_1268;
            auVar33._24_8_ = uStack_14a8;
            auVar33._0_24_ = auVar51._0_24_;
            auVar32._8_8_ = uStack_1278;
            auVar32._0_8_ = local_1280;
            auVar32._16_8_ = uStack_1270;
            auVar32._24_8_ = uStack_1268;
            local_600 = vpsubd_avx2(auVar33,auVar32);
            local_1520._0_8_ = auVar25._0_8_;
            local_1520._8_8_ = auVar25._8_8_;
            local_1520._16_8_ = auVar25._16_8_;
            uStack_1508 = auVar23._24_8_;
            local_bc0 = local_1520._0_8_;
            uStack_bb8 = local_1520._8_8_;
            uStack_bb0 = local_1520._16_8_;
            uStack_ba8 = uStack_1508;
            local_be0 = local_12a0;
            uStack_bd8 = uStack_1298;
            uStack_bd0 = uStack_1290;
            uStack_bc8 = uStack_1288;
            auVar31._24_8_ = uStack_1508;
            auVar31._0_24_ = auVar25._0_24_;
            auVar30._8_8_ = uStack_1298;
            auVar30._0_8_ = local_12a0;
            auVar30._16_8_ = uStack_1290;
            auVar30._24_8_ = uStack_1288;
            local_620 = vpsubd_avx2(auVar31,auVar30);
            auVar51 = vpmaxsd_avx2(local_600,local_620);
            local_c00 = local_14e0._0_8_;
            uStack_bf8 = local_14e0._8_8_;
            uStack_bf0 = local_14e0._16_8_;
            uStack_be8 = uStack_14c8;
            local_c20 = local_1280;
            uStack_c18 = uStack_1278;
            uStack_c10 = uStack_1270;
            uStack_c08 = uStack_1268;
            auVar29._8_8_ = uStack_1278;
            auVar29._0_8_ = local_1280;
            auVar29._16_8_ = uStack_1270;
            auVar29._24_8_ = uStack_1268;
            local_640 = vpsubd_avx2(_local_14e0,auVar29);
            local_c40 = local_1500._0_8_;
            uStack_c38 = local_1500._8_8_;
            uStack_c30 = local_1500._16_8_;
            uStack_c28 = local_1500._24_8_;
            local_c60 = local_12a0;
            uStack_c58 = uStack_1298;
            uStack_c50 = uStack_1290;
            uStack_c48 = uStack_1288;
            auVar22._8_8_ = uStack_1298;
            auVar22._0_8_ = local_12a0;
            auVar22._16_8_ = uStack_1290;
            auVar22._24_8_ = uStack_1288;
            local_660 = vpsubd_avx2(local_1500,auVar22);
            auVar25 = vpmaxsd_avx2(local_640,local_660);
            local_d64 = *(undefined4 *)
                         (lVar9 + (long)(iVar1 * local_183c) * 4 +
                         (long)local_1188[(int)local_11a8] * 4);
            local_d68 = *(undefined4 *)
                         (lVar10 + (long)(iVar2 * local_1854) * 4 +
                         (long)local_1188[(int)(local_11a8 - 1)] * 4);
            local_d6c = *(undefined4 *)
                         (lVar11 + (long)(iVar3 * local_186c) * 4 +
                         (long)local_1188[(int)(local_11a8 - 2)] * 4);
            local_d70 = *(uint *)(lVar12 + (long)(iVar4 * local_1884) * 4 +
                                 (long)local_1188[(int)(local_11a8 - 3)] * 4);
            local_d74 = *(undefined4 *)
                         (lVar13 + (long)(iVar5 * local_189c) * 4 +
                         (long)local_1188[(int)(local_11a8 - 4)] * 4);
            local_d78 = *(undefined4 *)
                         (lVar14 + (long)(iVar6 * local_18b4) * 4 +
                         (long)local_1188[(int)(local_11a8 - 5)] * 4);
            local_d7c = *(undefined4 *)
                         (lVar15 + (long)(iVar7 * local_18cc) * 4 +
                         (long)local_1188[(int)(local_11a8 - 6)] * 4);
            local_d80 = *(uint *)(lVar16 + (long)(iVar8 * local_18e4) * 4 +
                                 (long)local_1188[(int)(local_11a8 - 7)] * 4);
            auVar18 = vpinsrd_avx(ZEXT416(local_d80),local_d7c,1);
            auVar18 = vpinsrd_avx(auVar18,local_d78,2);
            local_da0 = vpinsrd_avx(auVar18,local_d74,3);
            auVar18 = vpinsrd_avx(ZEXT416(local_d70),local_d6c,1);
            auVar18 = vpinsrd_avx(auVar18,local_d68,2);
            auStack_d90 = vpinsrd_avx(auVar18,local_d64,3);
            uStack_15f8 = auVar24._8_8_;
            uStack_15f0 = auVar24._16_8_;
            uStack_538 = uStack_15f8;
            uStack_530 = uStack_15f0;
            local_560 = local_da0._0_8_;
            uStack_558 = local_da0._8_8_;
            uStack_550 = auStack_d90._0_8_;
            uStack_548 = auStack_d90._8_8_;
            auVar40._16_8_ = auStack_d90._0_8_;
            auVar40._0_16_ = local_da0;
            auVar40._24_8_ = auStack_d90._8_8_;
            auVar24 = vpaddd_avx2(auVar24,auVar40);
            local_1600 = auVar24._0_8_;
            uStack_15f8 = auVar24._8_8_;
            uStack_15f0 = auVar24._16_8_;
            uStack_15e8 = auVar24._24_8_;
            local_1500._0_8_ = auVar25._0_8_;
            local_1500._8_8_ = auVar25._8_8_;
            local_1500._16_8_ = auVar25._16_8_;
            local_1500._24_8_ = auVar25._24_8_;
            local_680 = local_1600;
            uStack_678 = uStack_15f8;
            uStack_670 = uStack_15f0;
            uStack_668 = uStack_15e8;
            local_6a0 = local_1500._0_8_;
            uStack_698 = local_1500._8_8_;
            uStack_690 = local_1500._16_8_;
            uStack_688 = local_1500._24_8_;
            auVar24 = vpmaxsd_avx2(auVar24,auVar25);
            local_14e0._0_8_ = auVar24._0_8_;
            local_14e0._8_8_ = auVar24._8_8_;
            local_14e0._16_8_ = auVar24._16_8_;
            uStack_14c8 = auVar24._24_8_;
            local_1520._0_8_ = auVar51._0_8_;
            local_1520._8_8_ = auVar51._8_8_;
            local_1520._16_8_ = auVar51._16_8_;
            uStack_1508 = auVar51._24_8_;
            local_6c0 = local_14e0._0_8_;
            uStack_6b8 = local_14e0._8_8_;
            uStack_6b0 = local_14e0._16_8_;
            uStack_6a8 = uStack_14c8;
            local_6e0 = local_1520._0_8_;
            uStack_6d8 = local_1520._8_8_;
            uStack_6d0 = local_1520._16_8_;
            uStack_6c8 = uStack_1508;
            auVar23 = vpmaxsd_avx2(auVar24,auVar51);
            local_8c0 = local_1540._0_8_;
            uStack_8b8 = local_1540._8_8_;
            uStack_8b0 = local_1540._16_8_;
            uStack_8a8 = local_1540._24_8_;
            local_8e0 = local_1320;
            uStack_8d8 = uStack_1318;
            uStack_8d0 = uStack_1310;
            uStack_8c8 = uStack_1308;
            auVar38._8_8_ = uStack_1318;
            auVar38._0_8_ = local_1320;
            auVar38._16_8_ = uStack_1310;
            auVar38._24_8_ = uStack_1308;
            auVar24 = vpcmpeqd_avx2(local_1540,auVar38);
            local_14e0._0_8_ = auVar23._0_8_;
            local_14e0._8_8_ = auVar23._8_8_;
            local_14e0._16_8_ = auVar23._16_8_;
            uStack_14c8 = auVar23._24_8_;
            local_1620 = auVar24._0_8_;
            uStack_1618 = auVar24._8_8_;
            uStack_1610 = auVar24._16_8_;
            uStack_1608 = auVar24._24_8_;
            local_240 = local_14e0._0_8_;
            uStack_238 = local_14e0._8_8_;
            uStack_230 = local_14e0._16_8_;
            uStack_228 = uStack_14c8;
            local_260 = local_14a0._0_8_;
            uStack_258 = local_14a0._8_8_;
            uStack_250 = local_14a0._16_8_;
            uStack_248 = local_14a0._24_8_;
            local_280 = local_1620;
            uStack_278 = uStack_1618;
            uStack_270 = uStack_1610;
            uStack_268 = uStack_1608;
            _local_14e0 = vpblendvb_avx2(auVar23,local_14a0,auVar24);
            local_2a0 = local_1520._0_8_;
            uStack_298 = local_1520._8_8_;
            uStack_290 = local_1520._16_8_;
            uStack_288 = uStack_1508;
            local_2c0 = local_1260;
            uStack_2b8 = uStack_1258;
            uStack_2b0 = uStack_1250;
            uStack_2a8 = uStack_1248;
            local_2e0 = local_1620;
            uStack_2d8 = uStack_1618;
            uStack_2d0 = uStack_1610;
            uStack_2c8 = uStack_1608;
            auVar42._8_8_ = uStack_1258;
            auVar42._0_8_ = local_1260;
            auVar42._16_8_ = uStack_1250;
            auVar42._24_8_ = uStack_1248;
            _local_1520 = vpblendvb_avx2(auVar51,auVar42,auVar24);
            local_300 = local_1500._0_8_;
            uStack_2f8 = local_1500._8_8_;
            uStack_2f0 = local_1500._16_8_;
            uStack_2e8 = local_1500._24_8_;
            local_320 = local_1260;
            uStack_318 = uStack_1258;
            uStack_310 = uStack_1250;
            uStack_308 = uStack_1248;
            local_340 = local_1620;
            uStack_338 = uStack_1618;
            uStack_330 = uStack_1610;
            uStack_328 = uStack_1608;
            auVar41._8_8_ = uStack_1258;
            auVar41._0_8_ = local_1260;
            auVar41._16_8_ = uStack_1250;
            auVar41._24_8_ = uStack_1248;
            local_1500 = vpblendvb_avx2(auVar25,auVar41,auVar24);
            uVar43 = local_14e0._0_8_;
            if (local_114c < (int)local_11a8) {
              local_200 = local_1220._0_8_;
              uStack_1f8 = local_1220._8_8_;
              uStack_1f0 = local_1220._16_8_;
              uStack_1e8 = local_1220._24_8_;
              local_220 = local_14e0._0_8_;
              uStack_218 = local_14e0._8_8_;
              uStack_210 = local_14e0._16_8_;
              uStack_208 = uStack_14c8;
              local_1220 = vpminsd_avx2(local_1220,_local_14e0);
              local_700 = local_1240._0_8_;
              uStack_6f8 = local_1240._8_8_;
              uStack_6f0 = local_1240._16_8_;
              uStack_6e8 = local_1240._24_8_;
              local_720 = local_14e0._0_8_;
              uStack_718 = local_14e0._8_8_;
              uStack_710 = local_14e0._16_8_;
              uStack_708 = uStack_14c8;
              local_1240 = vpmaxsd_avx2(local_1240,_local_14e0);
            }
            vWH_00[0]._4_4_ = iVar52;
            vWH_00[0]._0_4_ = in_stack_ffffffffffffe6d8;
            vWH_00[1] = uVar53;
            vWH_00[2] = uVar54;
            vWH_00[3] = lVar55;
            arr_store_si256(in_stack_ffffffffffffe700,vWH_00,(int32_t)((ulong)local_1188 >> 0x20),
                            (int32_t)local_1188,in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8)
            ;
            local_1190[(int)(local_11a8 - 7)] = local_14e0._0_4_;
            local_1198[(int)(local_11a8 - 7)] = local_1520._0_4_;
            local_900 = local_1540._0_8_;
            uStack_8f8 = local_1540._8_8_;
            uStack_8f0 = local_1540._16_8_;
            uStack_8e8 = local_1540._24_8_;
            local_1480 = auVar27._0_8_;
            local_920 = local_1480;
            uStack_1478 = auVar27._8_8_;
            uStack_918 = uStack_1478;
            uStack_1470 = auVar27._16_8_;
            uStack_910 = uStack_1470;
            uStack_1468 = auVar27._24_8_;
            uStack_908 = uStack_1468;
            auVar25 = vpcmpeqd_avx2(local_1540,auVar27);
            local_980 = local_1540._0_8_;
            uStack_978 = local_1540._8_8_;
            uStack_970 = local_1540._16_8_;
            uStack_968 = local_1540._24_8_;
            local_9a0 = local_1320;
            uStack_998 = uStack_1318;
            uStack_990 = uStack_1310;
            uStack_988 = uStack_1308;
            auVar37._8_8_ = uStack_1318;
            auVar37._0_8_ = local_1320;
            auVar37._16_8_ = uStack_1310;
            auVar37._24_8_ = uStack_1308;
            auVar51 = vpcmpgtd_avx2(local_1540,auVar37);
            uStack_9b0 = uVar48;
            uStack_9a8 = uVar49;
            local_9e0 = local_1540._0_8_;
            uStack_9d8 = local_1540._8_8_;
            uStack_9d0 = local_1540._16_8_;
            uStack_9c8 = local_1540._24_8_;
            auVar36._16_8_ = uVar48;
            auVar36._0_16_ = auVar50._0_16_;
            auVar36._24_8_ = uVar49;
            auVar23 = vpcmpgtd_avx2(auVar36,local_1540);
            local_15a0 = auVar21._0_8_;
            local_80 = local_15a0;
            uStack_1598 = auVar21._8_8_;
            uStack_78 = uStack_1598;
            uStack_1590 = auVar21._16_8_;
            uStack_70 = uStack_1590;
            uStack_1588 = auVar21._24_8_;
            uStack_68 = uStack_1588;
            local_1640 = auVar25._0_8_;
            local_a0 = local_1640;
            uStack_1638 = auVar25._8_8_;
            uStack_98 = uStack_1638;
            uStack_1630 = auVar25._16_8_;
            uStack_90 = uStack_1630;
            uStack_1628 = auVar25._24_8_;
            uStack_88 = uStack_1628;
            auVar24 = vpand_avx2(auVar21,auVar25);
            local_15c0 = auVar20._0_8_;
            local_100 = local_15c0;
            uStack_15b8 = auVar20._8_8_;
            uStack_f8 = uStack_15b8;
            uStack_15b0 = auVar20._16_8_;
            uStack_f0 = uStack_15b0;
            uStack_15a8 = auVar20._24_8_;
            uStack_e8 = uStack_15a8;
            local_1660 = auVar51._0_8_;
            local_c0 = local_1660;
            uStack_1658 = auVar51._8_8_;
            uStack_b8 = uStack_1658;
            uStack_1650 = auVar51._16_8_;
            uStack_b0 = uStack_1650;
            uStack_1648 = auVar51._24_8_;
            uStack_a8 = uStack_1648;
            local_1680 = auVar23._0_8_;
            local_e0 = local_1680;
            uStack_1678 = auVar23._8_8_;
            uStack_d8 = uStack_1678;
            uStack_1670 = auVar23._16_8_;
            uStack_d0 = uStack_1670;
            uStack_1668 = auVar23._24_8_;
            uStack_c8 = uStack_1668;
            local_120 = vpand_avx2(auVar51,auVar23);
            auVar51 = vpand_avx2(auVar20,local_120);
            local_a00 = uVar43;
            uStack_9f8 = local_14e0._8_8_;
            uStack_9f0 = local_14e0._16_8_;
            uStack_9e8 = uStack_14c8;
            local_a20 = local_1380._0_8_;
            uStack_a18 = local_1380._8_8_;
            uStack_a10 = local_1380._16_8_;
            uStack_a08 = local_1380._24_8_;
            auVar23 = vpcmpgtd_avx2(_local_14e0,local_1380);
            local_a40 = uVar43;
            uStack_a38 = local_14e0._8_8_;
            uStack_a30 = local_14e0._16_8_;
            uStack_a28 = uStack_14c8;
            local_a60 = local_13a0._0_8_;
            uStack_a58 = local_13a0._8_8_;
            uStack_a50 = local_13a0._16_8_;
            uStack_a48 = local_13a0._24_8_;
            auVar22 = vpcmpgtd_avx2(_local_14e0,local_13a0);
            local_140 = local_15c0;
            uStack_138 = uStack_15b8;
            uStack_130 = uStack_15b0;
            uStack_128 = uStack_15a8;
            local_160 = local_1640;
            uStack_158 = uStack_1638;
            uStack_150 = uStack_1630;
            uStack_148 = uStack_1628;
            auVar25 = vpand_avx2(auVar20,auVar25);
            local_16e0 = auVar23._0_8_;
            local_180 = local_16e0;
            uStack_16d8 = auVar23._8_8_;
            uStack_178 = uStack_16d8;
            uStack_16d0 = auVar23._16_8_;
            uStack_170 = uStack_16d0;
            uStack_16c8 = auVar23._24_8_;
            uStack_168 = uStack_16c8;
            local_16c0 = auVar51._0_8_;
            local_1a0 = local_16c0;
            uStack_16b8 = auVar51._8_8_;
            uStack_198 = uStack_16b8;
            uStack_16b0 = auVar51._16_8_;
            uStack_190 = uStack_16b0;
            uStack_16a8 = auVar51._24_8_;
            uStack_188 = uStack_16a8;
            auVar51 = vpand_avx2(auVar23,auVar51);
            local_1700 = auVar22._0_8_;
            local_1c0 = local_1700;
            uStack_16f8 = auVar22._8_8_;
            uStack_1b8 = uStack_16f8;
            uStack_16f0 = auVar22._16_8_;
            uStack_1b0 = uStack_16f0;
            uStack_16e8 = auVar22._24_8_;
            uStack_1a8 = uStack_16e8;
            local_16a0 = auVar24._0_8_;
            local_1e0 = local_16a0;
            uStack_1698 = auVar24._8_8_;
            uStack_1d8 = uStack_1698;
            uStack_1690 = auVar24._16_8_;
            uStack_1d0 = uStack_1690;
            uStack_1688 = auVar24._24_8_;
            uStack_1c8 = uStack_1688;
            auVar24 = vpand_avx2(auVar22,auVar24);
            local_360 = local_1380._0_8_;
            uStack_358 = local_1380._8_8_;
            uStack_350 = local_1380._16_8_;
            uStack_348 = local_1380._24_8_;
            local_380 = uVar43;
            uStack_378 = local_14e0._8_8_;
            uStack_370 = local_14e0._16_8_;
            uStack_368 = uStack_14c8;
            local_1740 = auVar51._0_8_;
            local_3a0 = local_1740;
            uStack_1738 = auVar51._8_8_;
            uStack_398 = uStack_1738;
            uStack_1730 = auVar51._16_8_;
            uStack_390 = uStack_1730;
            uStack_1728 = auVar51._24_8_;
            uStack_388 = uStack_1728;
            local_1380 = vpblendvb_avx2(local_1380,_local_14e0,auVar51);
            local_3c0 = local_13a0._0_8_;
            uStack_3b8 = local_13a0._8_8_;
            uStack_3b0 = local_13a0._16_8_;
            uStack_3a8 = local_13a0._24_8_;
            local_3e0 = uVar43;
            uStack_3d8 = local_14e0._8_8_;
            uStack_3d0 = local_14e0._16_8_;
            uStack_3c8 = uStack_14c8;
            local_1760 = auVar24._0_8_;
            local_400 = local_1760;
            uStack_1758 = auVar24._8_8_;
            uStack_3f8 = uStack_1758;
            uStack_1750 = auVar24._16_8_;
            uStack_3f0 = uStack_1750;
            uStack_1748 = auVar24._24_8_;
            uStack_3e8 = uStack_1748;
            local_13a0 = vpblendvb_avx2(local_13a0,_local_14e0,auVar24);
            local_420 = local_13c0._0_8_;
            uStack_418 = local_13c0._8_8_;
            uStack_410 = local_13c0._16_8_;
            uStack_408 = local_13c0._24_8_;
            local_440 = uVar43;
            uStack_438 = local_14e0._8_8_;
            uStack_430 = local_14e0._16_8_;
            uStack_428 = uStack_14c8;
            local_1720 = auVar25._0_8_;
            local_460 = local_1720;
            uStack_1718 = auVar25._8_8_;
            uStack_458 = uStack_1718;
            uStack_1710 = auVar25._16_8_;
            uStack_450 = uStack_1710;
            uStack_1708 = auVar25._24_8_;
            uStack_448 = uStack_1708;
            local_13c0 = vpblendvb_avx2(local_13c0,_local_14e0,auVar25);
            local_480 = local_13e0._0_8_;
            uStack_478 = local_13e0._8_8_;
            uStack_470 = local_13e0._16_8_;
            uStack_468 = local_13e0._24_8_;
            local_4a0 = local_1340._0_8_;
            uStack_498 = local_1340._8_8_;
            uStack_490 = local_1340._16_8_;
            uStack_488 = local_1340._24_8_;
            local_4c0 = local_1760;
            uStack_4b8 = uStack_1758;
            uStack_4b0 = uStack_1750;
            uStack_4a8 = uStack_1748;
            local_13e0 = vpblendvb_avx2(local_13e0,local_1340,auVar24);
            local_4e0 = local_1400._0_8_;
            uStack_4d8 = local_1400._8_8_;
            uStack_4d0 = local_1400._16_8_;
            uStack_4c8 = local_1400._24_8_;
            local_500 = local_1540._0_8_;
            uStack_4f8 = local_1540._8_8_;
            uStack_4f0 = local_1540._16_8_;
            uStack_4e8 = local_1540._24_8_;
            local_520 = local_1740;
            uStack_518 = uStack_1738;
            uStack_510 = uStack_1730;
            uStack_508 = uStack_1728;
            local_1400 = vpblendvb_avx2(local_1400,local_1540,auVar51);
            local_580 = local_1540._0_8_;
            uStack_578 = local_1540._8_8_;
            uStack_570 = local_1540._16_8_;
            uStack_568 = local_1540._24_8_;
            local_5a0 = local_12c0;
            uStack_598 = uStack_12b8;
            uStack_590 = uStack_12b0;
            uStack_588 = uStack_12a8;
            auVar39._8_8_ = uStack_12b8;
            auVar39._0_8_ = local_12c0;
            auVar39._16_8_ = uStack_12b0;
            auVar39._24_8_ = uStack_12a8;
            local_1540 = vpaddd_avx2(local_1540,auVar39);
            local_11a8 = local_11a8 + 1;
            _local_14c0 = auVar34;
            local_9c0 = auVar50._0_16_;
          }
          local_5c0 = local_1340._0_8_;
          uStack_5b8 = local_1340._8_8_;
          uStack_5b0 = local_1340._16_8_;
          uStack_5a8 = local_1340._24_8_;
          uStack_5d0 = auStack_12d0._0_8_;
          uStack_5c8 = auStack_12d0._8_8_;
          auVar23._16_8_ = auStack_12d0._0_8_;
          auVar23._0_16_ = local_12e0;
          auVar23._24_8_ = auStack_12d0._8_8_;
          local_1340 = vpaddd_avx2(local_1340,auVar23);
          local_c80 = local_14a0._0_8_;
          uStack_c78 = local_14a0._8_8_;
          uStack_c70 = local_14a0._16_8_;
          uStack_c68 = local_14a0._24_8_;
          uStack_c90 = auStack_12f0._0_8_;
          uStack_c88 = auStack_12f0._8_8_;
          auVar25._16_8_ = auStack_12f0._0_8_;
          auVar25._0_16_ = local_1300;
          auVar25._24_8_ = auStack_12f0._8_8_;
          local_14a0 = vpsubd_avx2(local_14a0,auVar25);
          local_5e0 = local_12e0;
          local_ca0 = local_1300;
        }
        local_1764 = local_11b4;
        local_1768 = local_11b4;
        local_176c = local_11b4;
        local_1778 = (uint *)local_1380;
        local_1780 = (uint *)local_13a0;
        local_1788 = (uint *)local_13c0;
        local_1790 = (int *)local_13e0;
        local_1798 = (int *)local_1400;
        for (local_179c = 0; local_179c < local_1148; local_179c = local_179c + 1) {
          if (((int)local_1768 < (int)*local_1780) ||
             ((*local_1780 == local_1768 && (*local_1790 < local_11ac)))) {
            local_1768 = *local_1780;
            local_11ac = *local_1790;
          }
          if ((int)local_1764 < (int)*local_1778) {
            local_1764 = *local_1778;
            local_11b0 = *local_1798;
          }
          if ((int)local_176c < (int)*local_1788) {
            local_176c = *local_1788;
          }
          local_1778 = local_1778 + 1;
          local_1780 = local_1780 + 1;
          local_1788 = local_1788 + 1;
          local_1790 = local_1790 + 1;
          local_1798 = local_1798 + 1;
        }
        if ((s1_beg == 0) || (s2_beg == 0)) {
          if (s1_beg == 0) {
            if (s2_beg == 0) {
              local_11bc = local_176c;
              local_11b0 = local_113c - 1;
            }
            else {
              local_11bc = local_1764;
            }
            local_11ac = local_1154 - 1;
          }
          else {
            local_11bc = local_1768;
            local_11b0 = local_113c - 1;
          }
        }
        else if (((int)local_1764 < (int)local_1768) ||
                ((local_1768 == local_1764 && (local_11b0 == local_113c - 1)))) {
          local_11bc = local_1768;
          local_11b0 = local_113c - 1;
        }
        else {
          local_11bc = local_1764;
          local_11ac = local_1154 - 1;
        }
        local_a80 = local_11e0;
        uStack_a78 = uStack_11d8;
        uStack_a70 = uStack_11d0;
        uStack_a68 = uStack_11c8;
        local_aa0 = local_1220._0_8_;
        uStack_a98 = local_1220._8_8_;
        uStack_a90 = local_1220._16_8_;
        uStack_a88 = local_1220._24_8_;
        auVar35._8_8_ = uStack_11d8;
        auVar35._0_8_ = local_11e0;
        auVar35._16_8_ = uStack_11d0;
        auVar35._24_8_ = uStack_11c8;
        local_840 = vpcmpgtd_avx2(auVar35,local_1220);
        local_ac0 = local_1240._0_8_;
        uStack_ab8 = local_1240._8_8_;
        uStack_ab0 = local_1240._16_8_;
        uStack_aa8 = local_1240._24_8_;
        local_ae0 = local_1200;
        uStack_ad8 = uStack_11f8;
        uStack_ad0 = uStack_11f0;
        uStack_ac8 = uStack_11e8;
        auVar34._8_8_ = uStack_11f8;
        auVar34._0_8_ = local_1200;
        auVar34._16_8_ = uStack_11f0;
        auVar34._24_8_ = uStack_11e8;
        local_860 = vpcmpgtd_avx2(local_1240,auVar34);
        local_60 = vpor_avx2(local_840,local_860);
        if ((((((((((((((((((((((((((((((((local_60 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_60 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_60 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_60 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_60 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_60 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_60 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_60 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_60 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_60 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_60 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_60 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_60 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_60 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_60 >> 0x7f,0) != '\0') ||
                          (local_60 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_60 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_60 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_60 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_60 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_60 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_60 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_60 >> 0xbf,0) != '\0') ||
                  (local_60 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_60 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_60 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_60 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_60 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_60 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_60 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_60[0x1f] < '\0') {
          local_11a0->flag = local_11a0->flag | 0x40;
          local_11bc = 0;
          local_11ac = 0;
          local_11b0 = 0;
        }
        local_11a0->score = local_11bc;
        local_11a0->end_query = local_11ac;
        local_11a0->end_ref = local_11b0;
        parasail_free(local_1180);
        parasail_free(local_1178);
        parasail_free(local_1170);
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          parasail_free(local_1168);
        }
        local_1120 = local_11a0;
      }
    }
  }
  return local_1120;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxHRow;
    __m256i vMaxHCol;
    __m256i vLastVal;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi32(NEG_LIMIT);
    vOpen = _mm256_set1_epi32(open);
    vGap  = _mm256_set1_epi32(gap);
    vOne = _mm256_set1_epi32(1);
    vN = _mm256_set1_epi32(N);
    vGapN = s1_beg ? _mm256_set1_epi32(0) : _mm256_set1_epi32(gap*N);
    vNegOne = _mm256_set1_epi32(-1);
    vI = _mm256_set_epi32(0,1,2,3,4,5,6,7);
    vJreset = _mm256_set_epi32(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi32(s1Len);
    vILimit1 = _mm256_sub_epi32(vILimit, vOne);
    vJLimit = _mm256_set1_epi32(s2Len);
    vJLimit1 = _mm256_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm256_set1_epi32(0) : _mm256_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m256i vIltLimit = _mm256_cmplt_epi32_rpl(vI, vILimit);
        __m256i vIeqLimit1 = _mm256_cmpeq_epi32(vI, vILimit1);
        vNH = _mm256_srli_si256_rpl(vNH, 4);
        vNH = _mm256_insert_epi32_rpl(vNH, H_pr[-1], 7);
        vWH = _mm256_srli_si256_rpl(vWH, 4);
        vWH = _mm256_insert_epi32_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 4);
            vNH = _mm256_insert_epi32_rpl(vNH, H_pr[j], 7);
            vF = _mm256_srli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, F_pr[j], 7);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vNH, vOpen),
                    _mm256_sub_epi32(vF, vGap));
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vWH, vOpen),
                    _mm256_sub_epi32(vE, vGap));
            vMat = _mm256_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm256_add_epi32(vNWH, vMat);
            vWH = _mm256_max_epi32(vNWH, vE);
            vWH = _mm256_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vWH,0);
            F_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m256i vJeqLimit1 = _mm256_cmpeq_epi32(vJ, vJLimit1);
                __m256i vJgtNegOne = _mm256_cmpgt_epi32(vJ, vNegOne);
                __m256i vJltLimit = _mm256_cmplt_epi32_rpl(vJ, vJLimit);
                __m256i cond_j = _mm256_and_si256(vIltLimit, vJeqLimit1);
                __m256i cond_i = _mm256_and_si256(vIeqLimit1,
                        _mm256_and_si256(vJgtNegOne, vJltLimit));
                __m256i cond_max_row = _mm256_cmpgt_epi32(vWH, vMaxHRow);
                __m256i cond_max_col = _mm256_cmpgt_epi32(vWH, vMaxHCol);
                __m256i cond_last_val = _mm256_and_si256(vIeqLimit1, vJeqLimit1);
                __m256i cond_all_row = _mm256_and_si256(cond_max_row, cond_i);
                __m256i cond_all_col = _mm256_and_si256(cond_max_col, cond_j);
                vMaxHRow = _mm256_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm256_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm256_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm256_add_epi32(vJ, vOne);
        }
        vI = _mm256_add_epi32(vI, vN);
        vIBoundary = _mm256_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}